

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

void SetContent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *content,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces,
               unsigned_long *endContentPosition,string *vec,cmListFileBacktrace *lfbt)

{
  pointer pcVar1;
  
  if (*endContentPosition ==
      (long)(content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(content,*endContentPosition + 2);
    std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::resize
              (backtraces,
               ((long)(backtraces->
                      super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(backtraces->
                      super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 4) + 2);
    std::__cxx11::string::_M_assign
              ((string *)
               ((content->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1));
    pcVar1 = (backtraces->
             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1[-1].TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lfbt->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&pcVar1[-1].TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(lfbt->TopEntry).
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    *endContentPosition =
         (long)(content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5;
    return;
  }
  __assert_fail("endContentPosition == content.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmStateDirectory.cxx"
                ,0xe1,
                "void SetContent(T &, U &, V &, const std::string &, const cmListFileBacktrace &) [T = std::vector<std::basic_string<char>>, U = std::vector<cmListFileBacktrace>, V = unsigned long]"
               );
}

Assistant:

void SetContent(T& content, U& backtraces, V& endContentPosition,
                const std::string& vec, const cmListFileBacktrace& lfbt)
{
  assert(endContentPosition == content.size());

  content.resize(content.size() + 2);
  backtraces.resize(backtraces.size() + 2);

  content.back() = vec;
  backtraces.back() = lfbt;

  endContentPosition = content.size();
}